

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleSubstringCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  const_reference name;
  ulong uVar6;
  ostream *poVar7;
  string local_3d0 [32];
  string local_3b0;
  ostringstream local_390 [8];
  ostringstream ostr_1;
  string local_218;
  ostringstream local_1f8 [8];
  ostringstream ostr;
  int intStringLength;
  size_t stringLength;
  string *variableName;
  int end;
  int begin;
  string *stringValue;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 == 5) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,2);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar1 = atoi(pcVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_20,3);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(pcVar5);
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_20,4);
    uVar6 = std::__cxx11::string::size();
    if ((iVar1 < 0) || ((int)uVar6 < iVar1)) {
      std::__cxx11::ostringstream::ostringstream(local_1f8);
      poVar7 = std::operator<<((ostream *)local_1f8,"begin index: ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar1);
      poVar7 = std::operator<<(poVar7," is out of range 0 - ");
      std::ostream::operator<<(poVar7,uVar6);
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1f8);
    }
    else if (iVar2 < -1) {
      std::__cxx11::ostringstream::ostringstream(local_390);
      poVar7 = std::operator<<((ostream *)local_390,"end index: ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
      std::operator<<(poVar7," should be -1 or greater");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_390);
    }
    else {
      this_00 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::substr((ulong)local_3d0,(ulong)pvVar4);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,name,pcVar5);
      std::__cxx11::string::~string(local_3d0);
      this_local._7_1_ = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"sub-command SUBSTRING requires four arguments.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand::HandleSubstringCommand(
  std::vector<std::string> const& args)
{
  if (args.size() != 5) {
    this->SetError("sub-command SUBSTRING requires four arguments.");
    return false;
  }

  const std::string& stringValue = args[1];
  int begin = atoi(args[2].c_str());
  int end = atoi(args[3].c_str());
  const std::string& variableName = args[4];

  size_t stringLength = stringValue.size();
  int intStringLength = static_cast<int>(stringLength);
  if (begin < 0 || begin > intStringLength) {
    std::ostringstream ostr;
    ostr << "begin index: " << begin << " is out of range 0 - "
         << stringLength;
    this->SetError(ostr.str());
    return false;
  }
  if (end < -1) {
    std::ostringstream ostr;
    ostr << "end index: " << end << " should be -1 or greater";
    this->SetError(ostr.str());
    return false;
  }

  this->Makefile->AddDefinition(variableName,
                                stringValue.substr(begin, end).c_str());
  return true;
}